

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dio.cpp
# Opt level: O0

void Dio(double *x,int x_length,int fs,DioOption *option,double *temporal_positions,double *f0)

{
  double *f0_local;
  double *temporal_positions_local;
  DioOption *option_local;
  int fs_local;
  int x_length_local;
  double *x_local;
  
  anon_unknown.dwarf_7e45::DioGeneralBody
            (x,x_length,fs,option->frame_period,option->f0_floor,option->f0_ceil,
             option->channels_in_octave,option->speed,option->allowed_range,temporal_positions,f0);
  return;
}

Assistant:

void Dio(const double *x, int x_length, int fs, const DioOption *option,
    double *temporal_positions, double *f0) {
  DioGeneralBody(x, x_length, fs, option->frame_period, option->f0_floor,
      option->f0_ceil, option->channels_in_octave, option->speed,
      option->allowed_range, temporal_positions, f0);
}